

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_export.cpp
# Opt level: O0

void __thiscall
sc_core::sc_export_registry::insert(sc_export_registry *this,sc_export_base *export_)

{
  bool bVar1;
  sc_simcontext *simc_p;
  sc_module *__x;
  vector<sc_core::sc_export_base_*,_std::allocator<sc_core::sc_export_base_*>_> *in_RSI;
  long in_RDI;
  sc_module *curr_module;
  char *in_stack_000001e0;
  char *in_stack_000001e8;
  sc_export_base *in_stack_000001f0;
  
  simc_p = sc_get_curr_simcontext();
  bVar1 = sc_is_running(simc_p);
  if (bVar1) {
    sc_export_base::report_error(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
  }
  else {
    bVar1 = sc_simcontext::elaboration_done(*(sc_simcontext **)(in_RDI + 0x20));
    if (bVar1) {
      sc_export_base::report_error(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
    }
    else {
      __x = sc_simcontext::hierarchy_curr((sc_simcontext *)0x225081);
      if (__x == (sc_module *)0x0) {
        sc_export_base::report_error(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
      }
      else {
        std::vector<sc_core::sc_export_base_*,_std::allocator<sc_core::sc_export_base_*>_>::
        push_back(in_RSI,(value_type *)__x);
      }
    }
  }
  return;
}

Assistant:

void
sc_export_registry::insert( sc_export_base* export_ )
{
    if( sc_is_running() ) {
        export_->report_error(SC_ID_INSERT_EXPORT_, "simulation running");
        return;
    }

    if( m_simc->elaboration_done()  ) {
        export_->report_error(SC_ID_INSERT_EXPORT_, "elaboration done");
        return;
    }

#ifdef DEBUG_SYSTEMC
    // check if port_ is already inserted
    for( int i = size() - 1; i >= 0; -- i ) {
        if( export_ == m_export_vec[i] ) {
            export_->report_error( SC_ID_INSERT_EXPORT_,
                                   "export already inserted ");
            return;
        }
    }
#endif

    sc_module* curr_module = m_simc->hierarchy_curr();
    if( curr_module == 0 ) {
        export_->report_error( SC_ID_EXPORT_OUTSIDE_MODULE_ );
        return;
    }

    // insert
    m_export_vec.push_back( export_ );
}